

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAdapter::makeFuncfl
          (EAMAdapter *this,RealType latticeConstant,string *latticeType,int nrho,RealType drho,
          int nr,RealType dr,RealType rcut,vector<double,_std::allocator<double>_> *Z,
          vector<double,_std::allocator<double>_> *rho,vector<double,_std::allocator<double>_> *F)

{
  bool bVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  FuncflParameters funcflParam;
  EAMParameters eamParam;
  string *in_stack_fffffffffffffe48;
  AtomType *in_stack_fffffffffffffe50;
  FuncflParameters *this_00;
  FuncflParameters *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffec8;
  AtomType *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  string local_78 [32];
  undefined8 local_58;
  undefined8 local_10;
  
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  bVar1 = isEAM((EAMAdapter *)0x2fb9d7);
  if (bVar1) {
    AtomType::removeProperty(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    AtomType::removeProperty(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  std::__cxx11::string::string(local_78);
  local_58 = 0;
  __args_1 = (FuncflParameters *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fbaa8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fbace);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fbaf4);
  local_58 = local_10;
  std::__cxx11::string::operator=(local_78,in_RSI);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (in_stack_fffffffffffffe78,(EAMParameters *)__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe50,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)in_stack_fffffffffffffe48
            );
  AtomType::addProperty
            (in_stack_fffffffffffffed0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec8._M_pi);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fbc13);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x2fbc20);
  this_00 = (FuncflParameters *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (in_stack_fffffffffffffe78,__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)this_00,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)
             &stack0xfffffffffffffec0);
  AtomType::addProperty
            (in_stack_fffffffffffffed0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec8._M_pi);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fbc75);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)0x2fbc7f);
  FuncflParameters::~FuncflParameters(this_00);
  EAMParameters::~EAMParameters((EAMParameters *)0x2fbc99);
  return;
}

Assistant:

void EAMAdapter::makeFuncfl(RealType latticeConstant, std::string latticeType,
                              int nrho, RealType drho, int nr, RealType dr,
                              RealType rcut, vector<RealType> Z,
                              vector<RealType> rho, vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};

    eamParam.eamType         = eamFuncfl;
    eamParam.latticeConstant = latticeConstant;
    eamParam.latticeType     = latticeType;

    funcflParam.nrho = nrho;
    funcflParam.drho = drho;
    funcflParam.nr   = nr;
    funcflParam.dr   = dr;
    funcflParam.rcut = rcut;
    funcflParam.Z    = Z;
    funcflParam.rho  = rho;
    funcflParam.F    = F;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }